

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisnsf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  FILE *__stream;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  char *pcVar7;
  undefined8 uVar8;
  mapped_type *pmVar9;
  bool bVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_22a0;
  long local_2270;
  off_t i;
  char snsf_path [4096];
  string local_1260 [39];
  allocator local_1239;
  string local_1238 [32];
  undefined1 local_1218 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  uint32_t num;
  int num_error;
  string bytestr;
  size_t local_11c0;
  off_t offset;
  uint8_t *hex;
  bool in_number;
  allocator local_1191;
  string local_1190 [8];
  string hexstring;
  ulong local_1170;
  size_t romsize;
  size_t size_of_num;
  off_t offset_of_num;
  uint8_t exe [264];
  uint32_t count;
  uint32_t load_offset;
  char libname [4096];
  char *snsf_basename;
  int argnum;
  int argi;
  char *psfby;
  char *endptr;
  long longval;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  longval = (long)argv;
  argv_local._0_4_ = argc;
  if (argc == 1) {
    usage(*argv);
    return 1;
  }
  psfby = (char *)0x0;
  _argnum = (char *)0x0;
  snsf_basename._4_4_ = 1;
  while( true ) {
    bVar10 = false;
    if (snsf_basename._4_4_ < (int)argv_local) {
      bVar10 = **(char **)(longval + (long)snsf_basename._4_4_ * 8) == '-';
    }
    if (!bVar10) break;
    iVar4 = strcmp(*(char **)(longval + (long)snsf_basename._4_4_ * 8),"--help");
    if (iVar4 == 0) {
      usage(*(char **)longval);
      return 1;
    }
    iVar4 = strcmp(*(char **)(longval + (long)snsf_basename._4_4_ * 8),"--psfby");
    if ((iVar4 != 0) &&
       (iVar4 = strcmp(*(char **)(longval + (long)snsf_basename._4_4_ * 8),"--snsfby"), iVar4 != 0))
    {
      fprintf(_stderr,"Error: Unknown option \"%s\"\n",
              *(undefined8 *)(longval + (long)snsf_basename._4_4_ * 8));
      return 1;
    }
    if ((int)argv_local <= snsf_basename._4_4_ + 1) {
      fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
              *(undefined8 *)(longval + (long)snsf_basename._4_4_ * 8));
      return 1;
    }
    _argnum = *(char **)(longval + (long)(snsf_basename._4_4_ + 1) * 8);
    snsf_basename._4_4_ = snsf_basename._4_4_ + 2;
  }
  if ((int)argv_local - snsf_basename._4_4_ != 4) {
    fprintf(_stderr,"Error: Too few/more arguments\n");
    return 1;
  }
  uVar1 = *(undefined8 *)(longval + (long)snsf_basename._4_4_ * 8);
  sprintf((char *)&count,"%s.snsflib",uVar1);
  endptr = (char *)strtol(*(char **)(longval + (long)(snsf_basename._4_4_ + 1) * 8),&psfby,0x10);
  if (((*psfby != '\0') || (piVar5 = __errno_location(), *piVar5 == 0x22)) || ((long)endptr < 0)) {
    fprintf(_stderr,"Error: Number format error \"%s\"\n",
            *(undefined8 *)(longval + (long)(snsf_basename._4_4_ + 1) * 8));
    return 1;
  }
  exe._260_4_ = SUB84(endptr,0);
  endptr = (char *)strtol(*(char **)(longval + (long)(snsf_basename._4_4_ + 3) * 8),&psfby,10);
  if (((*psfby != '\0') || (piVar5 = __errno_location(), *piVar5 == 0x22)) || ((long)endptr < 0)) {
    fprintf(_stderr,"Error: Number format error \"%s\"\n",
            *(undefined8 *)(longval + (long)(snsf_basename._4_4_ + 3) * 8));
    return 1;
  }
  exe._256_4_ = SUB84(endptr,0);
  memset(&offset_of_num,0,0x108);
  size_of_num = 0;
  romsize = 0;
  local_1170 = 0;
  if (**(char **)(longval + (long)(snsf_basename._4_4_ + 2) * 8) == '=') {
    lVar2 = *(long *)(longval + 0x10 + (long)snsf_basename._4_4_ * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1190,(char *)(lVar2 + 1),&local_1191);
    std::allocator<char>::~allocator((allocator<char> *)&local_1191);
    uVar6 = std::__cxx11::string::length();
    if ((uVar6 & 1) == 0) {
      local_1170 = std::__cxx11::string::length();
      local_1170 = local_1170 >> 1;
      if (local_1170 < 0x101) {
        bVar3 = false;
        for (local_11c0 = 0; (long)local_11c0 < (long)local_1170; local_11c0 = local_11c0 + 1) {
          std::__cxx11::string::substr((ulong)&num,(ulong)local_1190);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          iVar4 = strcasecmp(pcVar7,"NN");
          if (iVar4 == 0) {
            if (romsize == 0) {
              size_of_num = local_11c0;
              romsize = 1;
              bVar3 = true;
            }
            else {
              if (!bVar3) {
                fprintf(_stderr,"Error: Multiple number field\n");
                argv_local._4_4_ = 1;
                bVar10 = true;
                goto LAB_00109d3b;
              }
              romsize = romsize + 1;
            }
LAB_00109d31:
            bVar10 = false;
          }
          else {
            bVar3 = false;
            pcVar7 = (char *)std::__cxx11::string::c_str();
            endptr = (char *)strtol(pcVar7,&psfby,0x10);
            if ((*psfby == '\0') && (piVar5 = __errno_location(), *piVar5 != 0x22)) {
              exe[local_11c0] = (uint8_t)endptr;
              goto LAB_00109d31;
            }
            __stream = _stderr;
            uVar8 = std::__cxx11::string::c_str();
            fprintf(__stream,"Error: Number format error \"%s\"\n",uVar8);
            argv_local._4_4_ = 1;
            bVar10 = true;
          }
LAB_00109d3b:
          std::__cxx11::string::~string((string *)&num);
          if (bVar10) goto LAB_00109d76;
        }
        bVar10 = false;
      }
      else {
        fprintf(_stderr,"Error: Output size error\n");
        argv_local._4_4_ = 1;
        bVar10 = true;
      }
    }
    else {
      fprintf(_stderr,"Error: Hex string length error\n");
      argv_local._4_4_ = 1;
      bVar10 = true;
    }
LAB_00109d76:
    std::__cxx11::string::~string(local_1190);
    if (bVar10) {
      return argv_local._4_4_;
    }
  }
  else {
    endptr = (char *)strtol(*(char **)(longval + (long)(snsf_basename._4_4_ + 2) * 8),&psfby,10);
    if (((*psfby != '\0') || (piVar5 = __errno_location(), *piVar5 == 0x22)) || ((long)endptr < 0))
    {
      fprintf(_stderr,"Error: Number format error \"%s\"\n",
              *(undefined8 *)(longval + (long)(snsf_basename._4_4_ + 2) * 8));
      return 1;
    }
    romsize = (size_t)endptr;
    local_1170._0_4_ = (uint32_t)endptr;
  }
  if (romsize < 5) {
    writeInt((uint8_t *)&offset_of_num,exe._260_4_);
    writeInt((uint8_t *)((long)&offset_of_num + 4),(uint32_t)local_1170);
    tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
    for (tags._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
        (uint)tags._M_t._M_impl.super__Rb_tree_header._M_node_count < (uint)exe._256_4_;
        tags._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (uint)tags._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1218);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1238,"_lib",&local_1239);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_1218,(key_type *)local_1238);
      std::__cxx11::string::operator=((string *)pmVar9,(char *)&count);
      std::__cxx11::string::~string(local_1238);
      std::allocator<char>::~allocator((allocator<char> *)&local_1239);
      if ((_argnum != (char *)0x0) && (iVar4 = strcmp(_argnum,""), iVar4 != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1260,"snsfby",(allocator *)(snsf_path + 0xfff));
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_1218,(key_type *)local_1260);
        std::__cxx11::string::operator=((string *)pmVar9,_argnum);
        std::__cxx11::string::~string(local_1260);
        std::allocator<char>::~allocator((allocator<char> *)(snsf_path + 0xfff));
      }
      sprintf((char *)&i,"%s-%04d.minisnsf",uVar1,
              (ulong)(uint)tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (-1 < (long)size_of_num) {
        for (local_2270 = 0; local_2270 < (long)romsize; local_2270 = local_2270 + 1) {
          exe[size_of_num + local_2270] =
               (uint8_t)((uint)tags._M_t._M_impl.super__Rb_tree_header._M_node_count >>
                        ((byte)(local_2270 << 3) & 0x1f));
        }
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&local_22a0,
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1218);
      bVar10 = exe2snsf((char *)&i,(uint8_t *)&offset_of_num,(uint32_t)local_1170 + 8,&local_22a0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map(&local_22a0);
      if (bVar10) {
        printf("Created %s\n",&i);
      }
      else {
        printf("Error: Unable to create %s\n",&i);
        tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1218);
    }
    argv_local._4_4_ = (uint)(tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0);
  }
  else {
    fprintf(_stderr,"Error: Output number size error\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	char *psfby = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--snsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];
			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	int argnum = argc - argi;
	if (argnum != 4) {
		fprintf(stderr, "Error: Too few/more arguments\n");
		return EXIT_FAILURE;
	}

	char * snsf_basename = argv[argi];

	char libname[PATH_MAX];
	sprintf(libname, "%s.snsflib", snsf_basename);

	longval = strtol(argv[argi + 1], &endptr, 16);
	if (*endptr != '\0' || errno == ERANGE || longval < 0) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
		return EXIT_FAILURE;
	}
	uint32_t load_offset = (uint32_t)longval;

	longval = strtol(argv[argi + 3], &endptr, 10);
	if (*endptr != '\0' || errno == ERANGE || longval < 0) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 3]);
		return EXIT_FAILURE;
	}
	uint32_t count = (uint32_t)longval;

	uint8_t exe[SNSF_EXE_HEADER_SIZE + 256];
	memset(exe, 0, SNSF_EXE_HEADER_SIZE + 256);

	off_t offset_of_num = 0;
	size_t size_of_num = 0;
	size_t romsize = 0;
	if (argv[argi + 2][0] == '=') {
		std::string hexstring(&argv[argi + 2][1]);

		if (hexstring.length() % 2 != 0) {
			fprintf(stderr, "Error: Hex string length error\n");
			return EXIT_FAILURE;
		}
		romsize = hexstring.length() / 2;
		if (romsize > 256) {
			fprintf(stderr, "Error: Output size error\n");
			return EXIT_FAILURE;
		}

		bool in_number = false;
		uint8_t * hex = &exe[SNSF_EXE_HEADER_SIZE];
		for (off_t offset = 0; offset < (off_t)romsize; offset++) {
			std::string bytestr = hexstring.substr(offset * 2, 2);

			if (strcasecmp(bytestr.c_str(), "NN") == 0) {
				if (size_of_num == 0) {
					offset_of_num = offset;
					size_of_num = 1;
					in_number = true;
				}
				else {
					if (!in_number) {
						fprintf(stderr, "Error: Multiple number field\n");
						return EXIT_FAILURE;
					}
					size_of_num++;
				}
			}
			else {
				in_number = false;

				longval = strtol(bytestr.c_str(), &endptr, 16);
				if (*endptr != '\0' || errno == ERANGE) {
					fprintf(stderr, "Error: Number format error \"%s\"\n", bytestr.c_str());
					return EXIT_FAILURE;
				}

				hex[offset] = (uint8_t)longval;
			}
		}
	} else {
		longval = strtol(argv[argi + 2], &endptr, 10);
		if (*endptr != '\0' || errno == ERANGE || longval < 0) {
			fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 2]);
			return EXIT_FAILURE;
		}
		romsize = size_of_num = (size_t)longval;
	}

	if (size_of_num > 4) {
		fprintf(stderr, "Error: Output number size error\n");
		return EXIT_FAILURE;
	}

	writeInt(&exe[0], load_offset);
	writeInt(&exe[4], (uint32_t)romsize);

	int num_error = 0;
	for (uint32_t num = 0; num < count; num++) {
		std::map<std::string, std::string> tags;
		tags["_lib"] = libname;

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["snsfby"] = psfby;
		}

		char snsf_path[PATH_MAX];
		sprintf(snsf_path, "%s-%04d.minisnsf", snsf_basename, num);

		// patch exe
		if (offset_of_num >= 0) {
			for (off_t i = 0; i < (off_t)size_of_num; i++) {
				exe[SNSF_EXE_HEADER_SIZE + offset_of_num + i] = (num >> (8 * i)) & 0xff;
			}
		}

		if (exe2snsf(snsf_path, exe, SNSF_EXE_HEADER_SIZE + (uint32_t)romsize, tags)) {
			printf("Created %s\n", snsf_path);
		}
		else {
			printf("Error: Unable to create %s\n", snsf_path);
			num_error++;
		}
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}